

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::ConversionData::ConversionData(ConversionData *this,FileDatabase *db)

{
  FileDatabase *db_local;
  ConversionData *this_local;
  
  ::std::
  set<const_Assimp::Blender::Object_*,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
  ::set(&this->objects);
  TempArray<std::vector,_aiMesh>::TempArray(&this->meshes);
  TempArray<std::vector,_aiCamera>::TempArray(&this->cameras);
  TempArray<std::vector,_aiLight>::TempArray(&this->lights);
  TempArray<std::vector,_aiMaterial>::TempArray(&this->materials);
  TempArray<std::vector,_aiTexture>::TempArray(&this->textures);
  ::std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::deque(&this->materials_raw);
  this->sentinel_cnt = 0;
  memset(this->next_texture,0,0x4c);
  this->db = db;
  return;
}

Assistant:

ConversionData(const FileDatabase& db)
            : sentinel_cnt()
            , next_texture()
            , db(db)
        {}